

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * GenImagePerlinNoise(Image *__return_storage_ptr__,int width,int height,int offsetX,
                           int offsetY,float scale)

{
  void *pvVar1;
  undefined1 uVar2;
  float fVar3;
  undefined4 local_44;
  int intensity;
  float p;
  float ny;
  float nx;
  int x;
  int y;
  Color *pixels;
  float scale_local;
  int offsetY_local;
  int offsetX_local;
  int height_local;
  int width_local;
  
  pvVar1 = malloc((long)(width * height) << 2);
  for (nx = 0.0; (int)nx < height; nx = (float)((int)nx + 1)) {
    for (ny = 0.0; (int)ny < width; ny = (float)((int)ny + 1)) {
      fVar3 = stb_perlin_fbm_noise3
                        (((float)((int)ny + offsetX) * scale) / (float)width,
                         ((float)((int)nx + offsetY) * scale) / (float)height,1.0,2.0,0.5,6);
      uVar2 = (undefined1)(int)(((fVar3 + 1.0) / 2.0) * 255.0);
      local_44 = CONCAT13(0xff,CONCAT12(uVar2,CONCAT11(uVar2,uVar2)));
      *(undefined4 *)((long)pvVar1 + (long)((int)nx * width + (int)ny) * 4) = local_44;
    }
  }
  __return_storage_ptr__->data = pvVar1;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImagePerlinNoise(int width, int height, int offsetX, int offsetY, float scale)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            float nx = (float)(x + offsetX)*scale/(float)width;
            float ny = (float)(y + offsetY)*scale/(float)height;

            // Typical values to start playing with:
            //   lacunarity = ~2.0   -- spacing between successive octaves (use exactly 2.0 for wrapping output)
            //   gain       =  0.5   -- relative weighting applied to each successive octave
            //   octaves    =  6     -- number of "octaves" of noise3() to sum

            // NOTE: We need to translate the data from [-1..1] to [0..1]
            float p = (stb_perlin_fbm_noise3(nx, ny, 1.0f, 2.0f, 0.5f, 6) + 1.0f)/2.0f;

            int intensity = (int)(p*255.0f);
            pixels[y*width + x] = (Color){intensity, intensity, intensity, 255};
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}